

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::ComputeSecondOrderRegressionCoefficients
               (int n,vector<double,_std::allocator<double>_> *coefficients)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  int iVar7;
  vector<double,_std::allocator<double>_> *in_RSI;
  int in_EDI;
  int i;
  int j;
  double norm;
  int a2;
  int a1;
  int a0;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  if ((in_EDI < 1) || (in_RSI == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    iVar1 = in_EDI * 2 + 1;
    sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar5 != (long)iVar1) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_RSI,CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    }
    iVar2 = (iVar1 * in_EDI * (in_EDI + 1)) / 3;
    iVar3 = ((iVar2 * (in_EDI * 3 * in_EDI + in_EDI * 3 + -1)) / 5) * iVar1;
    iVar7 = iVar2 * iVar2;
    local_30 = 0;
    for (local_2c = -in_EDI; local_2c <= in_EDI; local_2c = local_2c + 1) {
      iVar4 = iVar1 * local_2c * local_2c - iVar2;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_30);
      *pvVar6 = (double)iVar4 * (0.5 / (double)(iVar3 - iVar7));
      local_30 = local_30 + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ComputeSecondOrderRegressionCoefficients(
    int n, std::vector<double>* coefficients) {
  if (n <= 0 || NULL == coefficients) {
    return false;
  }

  const int a0(2 * n + 1);
  if (coefficients->size() != static_cast<std::size_t>(a0)) {
    coefficients->resize(a0);
  }
  const int a1(a0 * n * (n + 1) / 3);
  const int a2(a1 * (3 * n * n + 3 * n - 1) / 5);
  const double norm(0.5 / (a2 * a0 - a1 * a1));
  for (int j(-n), i(0); j <= n; ++j, ++i) {
    (*coefficients)[i] = (a0 * j * j - a1) * norm;
  }
  return true;
}